

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>
::flush_output(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>
               *this,int outputs)

{
  int outputs_local;
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>
  *this_local;
  
  if ((outputs & 1U) != 0) {
    JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::flush(&this->video_);
  }
  if ((outputs & 2U) != 0) {
    MOS::MOS6522::MOS6522<Oric::VIAPortHandler>::flush(&this->via_);
  }
  JustInTimeActor<Apple::DiskII,_Cycles,_1,_1>::flush(&this->diskii_);
  return;
}

Assistant:

void flush_output(int outputs) final {
			if(outputs & Output::Video) {
				video_.flush();
			}
			if(outputs & Output::Audio) {
				via_.flush();
			}
			diskii_.flush();
		}